

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestReaderTestparseWithNoErrorsTestingOffsets::runTestCase
          (TestReaderTestparseWithNoErrorsTestingOffsets *this)

{
  bool bVar1;
  long lVar2;
  size_type sVar3;
  Value *pVVar4;
  size_t sVar5;
  TestResult *this_00;
  char *file;
  Value *this_01;
  char *expr;
  Reader *this_02;
  Reader *in_RDI;
  bool ok;
  Value root;
  Reader reader;
  char *in_stack_fffffffffffffce8;
  Value *in_stack_fffffffffffffcf0;
  uint line;
  char *in_stack_fffffffffffffcf8;
  TestResult *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd08;
  Reader *in_stack_fffffffffffffd10;
  Reader *in_stack_fffffffffffffd20;
  Reader *in_stack_fffffffffffffd78;
  vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_> local_1b0;
  string local_198 [36];
  int in_stack_fffffffffffffe8c;
  Value *in_stack_fffffffffffffe90;
  Value local_140 [8];
  
  Json::Reader::Reader(in_stack_fffffffffffffd20);
  Json::Value::Value(in_stack_fffffffffffffcf0,(ValueType)((ulong)in_stack_fffffffffffffce8 >> 0x20)
                    );
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffe90,
             "{ \"property\" : [\"value\", \"value2\"], \"obj\" : { \"nested\" : 123, \"bool\" : true}, \"null\" : null, \"false\" : false }"
             ,(allocator *)&stack0xfffffffffffffe8f);
  bVar1 = Json::Reader::parse(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                              (Value *)in_stack_fffffffffffffd00,
                              SUB81((ulong)in_stack_fffffffffffffcf8 >> 0x38,0));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe8f);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  Json::Reader::getFormattedErrorMessages_abi_cxx11_(in_RDI);
  lVar2 = std::__cxx11::string::size();
  std::__cxx11::string::~string(local_198);
  if (lVar2 != 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  Json::Reader::getStructuredErrors(in_stack_fffffffffffffd78);
  sVar3 = std::vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
          ::size(&local_1b0);
  std::vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::
  ~vector((vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_> *)
          in_stack_fffffffffffffcf0);
  if (sVar3 != 0) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  pVVar4 = Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  sVar5 = Json::Value::getOffsetStart(pVVar4);
  if (sVar5 != 0xf) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  pVVar4 = Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  sVar5 = Json::Value::getOffsetLimit(pVVar4);
  if (sVar5 != 0x22) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  pVVar4 = Json::Value::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  sVar5 = Json::Value::getOffsetStart(pVVar4);
  if (sVar5 != 0x10) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  pVVar4 = Json::Value::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  sVar5 = Json::Value::getOffsetLimit(pVVar4);
  if (sVar5 != 0x17) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  pVVar4 = Json::Value::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  sVar5 = Json::Value::getOffsetStart(pVVar4);
  if (sVar5 != 0x19) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  pVVar4 = Json::Value::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  sVar5 = Json::Value::getOffsetLimit(pVVar4);
  if (sVar5 != 0x21) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  pVVar4 = Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  sVar5 = Json::Value::getOffsetStart(pVVar4);
  if (sVar5 != 0x2c) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  pVVar4 = Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  sVar5 = Json::Value::getOffsetLimit(pVVar4);
  if (sVar5 != 0x4c) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  pVVar4 = Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  sVar5 = Json::Value::getOffsetStart(pVVar4);
  if (sVar5 != 0x39) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  pVVar4 = Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  sVar5 = Json::Value::getOffsetLimit(pVVar4);
  if (sVar5 != 0x3c) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  pVVar4 = Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  sVar5 = Json::Value::getOffsetStart(pVVar4);
  if (sVar5 != 0x47) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  pVVar4 = Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  sVar5 = Json::Value::getOffsetLimit(pVVar4);
  if (sVar5 != 0x4b) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  pVVar4 = Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  sVar5 = Json::Value::getOffsetStart(pVVar4);
  if (sVar5 != 0x57) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  pVVar4 = Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  sVar5 = Json::Value::getOffsetLimit(pVVar4);
  if (sVar5 != 0x5b) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               (uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  }
  this_00 = (TestResult *)
            Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  file = (char *)Json::Value::getOffsetStart((Value *)this_00);
  if (file != (char *)0x67) {
    JsonTest::TestResult::addFailure
              (this_00,file,(uint)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
               in_stack_fffffffffffffce8);
  }
  this_01 = Json::Value::operator[](in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  expr = (char *)Json::Value::getOffsetLimit(this_01);
  line = (uint)((ulong)this_01 >> 0x20);
  if (expr != (char *)0x6c) {
    JsonTest::TestResult::addFailure(this_00,file,line,expr);
  }
  this_02 = (Reader *)Json::Value::getOffsetStart(local_140);
  if (this_02 != (Reader *)0x0) {
    JsonTest::TestResult::addFailure(this_00,file,line,expr);
  }
  sVar5 = Json::Value::getOffsetLimit(local_140);
  if (sVar5 != 0x6e) {
    JsonTest::TestResult::addFailure(this_00,file,line,expr);
  }
  Json::Value::~Value(pVVar4);
  Json::Reader::~Reader(this_02);
  return;
}

Assistant:

JSONTEST_FIXTURE(ReaderTest, parseWithNoErrorsTestingOffsets) {
  Json::Reader reader;
  Json::Value root;
  bool ok = reader.parse("{ \"property\" : [\"value\", \"value2\"], \"obj\" : "
                         "{ \"nested\" : 123, \"bool\" : true}, \"null\" : "
                         "null, \"false\" : false }",
                         root);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT(reader.getFormattedErrorMessages().size() == 0);
  JSONTEST_ASSERT(reader.getStructuredErrors().size() == 0);
  JSONTEST_ASSERT(root["property"].getOffsetStart() == 15);
  JSONTEST_ASSERT(root["property"].getOffsetLimit() == 34);
  JSONTEST_ASSERT(root["property"][0].getOffsetStart() == 16);
  JSONTEST_ASSERT(root["property"][0].getOffsetLimit() == 23);
  JSONTEST_ASSERT(root["property"][1].getOffsetStart() == 25);
  JSONTEST_ASSERT(root["property"][1].getOffsetLimit() == 33);
  JSONTEST_ASSERT(root["obj"].getOffsetStart() == 44);
  JSONTEST_ASSERT(root["obj"].getOffsetLimit() == 76);
  JSONTEST_ASSERT(root["obj"]["nested"].getOffsetStart() == 57);
  JSONTEST_ASSERT(root["obj"]["nested"].getOffsetLimit() == 60);
  JSONTEST_ASSERT(root["obj"]["bool"].getOffsetStart() == 71);
  JSONTEST_ASSERT(root["obj"]["bool"].getOffsetLimit() == 75);
  JSONTEST_ASSERT(root["null"].getOffsetStart() == 87);
  JSONTEST_ASSERT(root["null"].getOffsetLimit() == 91);
  JSONTEST_ASSERT(root["false"].getOffsetStart() == 103);
  JSONTEST_ASSERT(root["false"].getOffsetLimit() == 108);
  JSONTEST_ASSERT(root.getOffsetStart() == 0);
  JSONTEST_ASSERT(root.getOffsetLimit() == 110);
}